

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Maybe<kj::Own<const_kj::File,_std::nullptr_t>_> __thiscall
kj::anon_unknown_59::InMemoryDirectory::asFile
          (InMemoryDirectory *this,Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *lock,
          EntryImpl *entry,WriteMode mode)

{
  Mutex *this_00;
  undefined8 *puVar1;
  undefined8 *puVar2;
  long *plVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined8 uVar5;
  Disposer *extraout_RAX;
  undefined4 in_register_0000000c;
  long lVar6;
  String *pSVar7;
  File *extraout_RDX;
  File *extraout_RDX_00;
  File *extraout_RDX_01;
  File *extraout_RDX_02;
  byte in_R8B;
  String *ptrCopy;
  PathPtr path;
  Own<const_kj::File,_std::nullptr_t> OVar8;
  DebugExpression<bool> _kjCondition;
  Fault f;
  DebugExpression<bool> local_58;
  undefined7 uStack_57;
  long *local_50;
  Path local_48;
  
  lVar6 = CONCAT44(in_register_0000000c,mode);
  iVar4 = *(int *)(lVar6 + 0x18);
  if (iVar4 == 0) {
    local_58.value = (bool)(in_R8B & 1);
    if ((in_R8B & 1) == 0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                ((Fault *)&local_48,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x6b6,FAILED,"has(mode, WriteMode::CREATE)","_kjCondition,",&local_58);
      kj::_::Debug::Fault::fatal((Fault *)&local_48);
    }
    puVar1 = (undefined8 *)(entry->name).content.size_;
    uVar5 = (*(code *)**(undefined8 **)*puVar1)();
    puVar1[8] = uVar5;
    puVar1 = (undefined8 *)(entry->name).content.size_;
    puVar2 = (undefined8 *)puVar1[1];
    (**(code **)*puVar2)(&local_58,puVar2,*puVar1);
    if (((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
          *)(lVar6 + 0x18))->tag != 0) {
      OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
      ::destroy((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                 *)(lVar6 + 0x18));
    }
    plVar3 = local_50;
    *(ulong *)(lVar6 + 0x20) = CONCAT71(uStack_57,local_58.value);
    *(long **)(lVar6 + 0x28) = local_50;
    local_50 = (long *)0x0;
    *(undefined4 *)(lVar6 + 0x18) = 1;
    (**(code **)(*plVar3 + 0x28))(&local_48);
    plVar3 = local_50;
    OVar8.ptr = extraout_RDX_01;
    OVar8.disposer = (Disposer *)local_48.parts.size_;
    pSVar7 = (String *)local_48.parts.size_;
    if ((String *)local_48.parts.size_ != (String *)0x0) {
      pSVar7 = local_48.parts.ptr;
    }
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)pSVar7
    ;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer =
         (_func_int **)local_48.parts.size_;
    if (local_50 != (long *)0x0) {
      local_50 = (long *)0x0;
      OVar8 = (Own<const_kj::File,_std::nullptr_t>)
              (*(code *)**(undefined8 **)CONCAT71(uStack_57,local_58.value))
                        ((undefined8 *)CONCAT71(uStack_57,local_58.value),
                         (long)plVar3 + *(long *)(*plVar3 + -0x10));
    }
  }
  else if (iVar4 == 3) {
    SymlinkNode::parse(&local_48,(SymlinkNode *)(lVar6 + 0x20));
    this_00 = (Mutex *)(entry->name).content.ptr;
    if (this_00 != (Mutex *)0x0) {
      kj::_::Mutex::unlock(this_00,EXCLUSIVE,(Waiter *)0x0);
    }
    (entry->name).content.ptr = (char *)0x0;
    (entry->name).content.size_ = 0;
    path.parts.size_ = (size_t)local_48.parts.ptr;
    path.parts.ptr = (String *)lock;
    OVar8 = (Own<const_kj::File,_std::nullptr_t>)
            tryOpenFile(this,path,(WriteMode)local_48.parts.size_);
    if (local_48.parts.ptr != (String *)0x0) {
      iVar4 = (**(local_48.parts.disposer)->_vptr_ArrayDisposer)
                        (local_48.parts.disposer,local_48.parts.ptr,0x18,local_48.parts.size_,
                         local_48.parts.size_,ArrayDisposer::Dispose_<kj::String>::destruct);
      OVar8.disposer._4_4_ = extraout_var;
      OVar8.disposer._0_4_ = iVar4;
      OVar8.ptr = extraout_RDX_00;
    }
  }
  else if (iVar4 == 1) {
    (**(code **)(**(long **)(lVar6 + 0x28) + 0x28))(&local_48);
    OVar8.ptr = extraout_RDX;
    OVar8.disposer = (Disposer *)local_48.parts.size_;
    pSVar7 = (String *)local_48.parts.size_;
    if ((String *)local_48.parts.size_ != (String *)0x0) {
      pSVar7 = local_48.parts.ptr;
    }
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)pSVar7
    ;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer =
         (_func_int **)local_48.parts.size_;
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[11]>
              ((Fault *)&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x6ba,FAILED,(char *)0x0,"\"not a file\"",(char (*) [11])"not a file");
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    kj::_::Debug::Fault::~Fault((Fault *)&local_48);
    OVar8.ptr = extraout_RDX_02;
    OVar8.disposer = extraout_RAX;
  }
  return (Maybe<kj::Own<const_kj::File,_std::nullptr_t>_>)OVar8;
}

Assistant:

Maybe<Own<const File>> asFile(kj::Locked<Impl>& lock, EntryImpl& entry, WriteMode mode) const {
    if (entry.node.is<FileNode>()) {
      return entry.node.get<FileNode>().file->clone();
    } else if (entry.node.is<SymlinkNode>()) {
      // CREATE_PARENT doesn't apply to creating the parents of a symlink target. However, the
      // target itself can still be created.
      auto newPath = entry.node.get<SymlinkNode>().parse();
      lock.release();
      return tryOpenFile(newPath, mode - WriteMode::CREATE_PARENT);
    } else if (entry.node == nullptr) {
      KJ_ASSERT(has(mode, WriteMode::CREATE));
      lock->modified();
      return entry.init(FileNode { lock->newFile() });
    } else {
      KJ_FAIL_REQUIRE("not a file") { return kj::none; }
    }
  }